

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# powerset.h
# Opt level: O0

void __thiscall
wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>::FinitePowersetLattice
          (FinitePowersetLattice<wasm::LocalSet_*> *this,
          vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *setMembers)

{
  size_type sVar1;
  reference __k;
  mapped_type *pmVar2;
  ulong local_20;
  size_t i;
  vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *setMembers_local;
  FinitePowersetLattice<wasm::LocalSet_*> *this_local;
  
  sVar1 = std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::size(setMembers);
  FiniteIntPowersetLattice::FiniteIntPowersetLattice(&this->intLattice,sVar1);
  std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::vector
            (&this->members,setMembers);
  std::
  unordered_map<wasm::LocalSet_*,_unsigned_long,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_long>_>_>
  ::unordered_map(&this->memberIndices);
  local_20 = 0;
  while( true ) {
    sVar1 = std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::size(&this->members);
    if (sVar1 <= local_20) break;
    __k = std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::operator[]
                    (&this->members,local_20);
    pmVar2 = std::
             unordered_map<wasm::LocalSet_*,_unsigned_long,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_long>_>_>
             ::operator[](&this->memberIndices,__k);
    *pmVar2 = local_20;
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

FinitePowersetLattice(std::vector<T>&& setMembers)
    : intLattice(setMembers.size()), members(std::move(setMembers)) {
    for (size_t i = 0; i < members.size(); ++i) {
      memberIndices[members[i]] = i;
    }
  }